

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O0

void __thiscall
backward::StackTraceImpl<backward::system_tag::linux_tag>::~StackTraceImpl
          (StackTraceImpl<backward::system_tag::linux_tag> *this)

{
  StackTraceImplHolder::~StackTraceImplHolder((StackTraceImplHolder *)0x11ad7e);
  return;
}

Assistant:

NOINLINE
  size_t load_here(size_t depth = 32, void *context = nullptr,
                   void *error_addr = nullptr) {
    load_thread_info();
    set_context(context);
    set_error_addr(error_addr);
    if (depth == 0) {
      return 0;
    }
    _stacktrace.resize(depth);
    size_t trace_cnt = details::unwind(callback(*this), depth);
    _stacktrace.resize(trace_cnt);
    skip_n_firsts(0);
    return size();
  }